

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

void __thiscall cfd::core::Psbt::Combine(Psbt *this,Psbt *transaction)

{
  uchar *bytes_00;
  size_type len;
  CfdException *pCVar1;
  Transaction local_130;
  undefined1 local_ea;
  allocator local_e9;
  string local_e8;
  CfdSourceLocation local_c8;
  wally_psbt *local_b0;
  wally_psbt *psbt_pointer;
  string local_a0;
  CfdSourceLocation local_80;
  int local_64;
  wally_psbt *pwStack_60;
  int ret;
  wally_psbt *src_pointer;
  ByteData local_48;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  Psbt *transaction_local;
  Psbt *this_local;
  
  bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)transaction;
  GetData(&local_48,transaction);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,&local_48);
  ByteData::~ByteData(&local_48);
  pwStack_60 = (wally_psbt *)0x0;
  bytes_00 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  len = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  local_64 = wally_psbt_from_bytes(bytes_00,len,&stack0xffffffffffffffa0);
  if (local_64 != 0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x848;
    local_80.funcname = "Combine";
    logger::warn<int&>(&local_80,"wally_psbt_from_bytes NG[{}]",&local_64);
    psbt_pointer._6_1_ = 1;
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&local_a0,"psbt from bytes error.",(allocator *)((long)&psbt_pointer + 7));
    CfdException::CfdException(pCVar1,kCfdInternalError,&local_a0);
    psbt_pointer._6_1_ = 0;
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_b0 = (wally_psbt *)this->wally_psbt_pointer_;
  local_64 = wally_psbt_combine(local_b0,pwStack_60);
  wally_psbt_free(pwStack_60);
  if (local_64 != 0) {
    local_c8.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_c8.filename = local_c8.filename + 1;
    local_c8.line = 0x851;
    local_c8.funcname = "Combine";
    logger::warn<int&>(&local_c8,"wally_psbt_combine NG[{}]",&local_64);
    local_ea = 1;
    pCVar1 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_e8,"psbt combine error.",&local_e9);
    CfdException::CfdException(pCVar1,kCfdIllegalArgumentError,&local_e8);
    local_ea = 0;
    __cxa_throw(pCVar1,&CfdException::typeinfo,CfdException::~CfdException);
  }
  RebuildTransaction(&local_130,this->wally_psbt_pointer_);
  Transaction::operator=(&this->base_tx_,&local_130);
  Transaction::~Transaction(&local_130);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return;
}

Assistant:

void Psbt::Combine(const Psbt &transaction) {
  std::vector<uint8_t> bytes = transaction.GetData().GetBytes();
  struct wally_psbt *src_pointer = nullptr;
  int ret = wally_psbt_from_bytes(bytes.data(), bytes.size(), &src_pointer);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_from_bytes NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt from bytes error.");
  }

  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  ret = wally_psbt_combine(psbt_pointer, src_pointer);
  wally_psbt_free(src_pointer);  // free
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_psbt_combine NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt combine error.");
  }
  base_tx_ = RebuildTransaction(wally_psbt_pointer_);
}